

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_int(void)

{
  char cVar1;
  char cVar2;
  XSValue *pXVar3;
  wchar16 *pwVar4;
  char *pcVar5;
  long lVar6;
  void *pvVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  Status myStatus;
  Status myStatus_14;
  char lex_iv_2 [8];
  char lex_iv_1 [9];
  char lex_v_ran_iv_2 [12];
  char lex_v_ran_iv_1 [12];
  char data_canrep_2 [6];
  char data_canrep_1 [6];
  char lex_v_ran_v_2 [12];
  char lex_v_ran_v_1 [12];
  char data_rawstr_2 [9];
  char lex_v_ran_v_1_canrep [11];
  char lex_v_ran_v_2_canrep [12];
  char lex_v_ran_iv_1_canrep [11];
  char lex_v_ran_iv_2_canrep [12];
  char data_rawstr_1 [14];
  char lex_v_ran_v_0 [15];
  StrX local_128;
  char *local_118;
  Status local_10c;
  char local_108 [8];
  undefined8 local_100;
  undefined1 local_f8;
  char local_f0 [16];
  char local_e0 [16];
  char local_d0 [8];
  char local_c8 [8];
  char local_c0 [16];
  char local_b0 [12];
  int local_a4;
  char local_a0 [16];
  char local_90 [16];
  char local_80 [16];
  char local_70 [16];
  char local_60 [16];
  char local_50 [16];
  char local_40 [16];
  
  builtin_strncpy(local_40,"    1234     \n",0xf);
  builtin_strncpy(local_b0 + 8,"647",4);
  builtin_strncpy(local_b0,"+2147483",8);
  builtin_strncpy(local_c0 + 8,"648",4);
  builtin_strncpy(local_c0,"-2147483",8);
  builtin_strncpy(local_e0 + 8,"648",4);
  builtin_strncpy(local_e0,"+2147483",8);
  builtin_strncpy(local_f0 + 8,"649",4);
  builtin_strncpy(local_f0,"-2147483",8);
  builtin_strncpy(local_90,"2147483647",0xb);
  builtin_strncpy(local_80 + 8,"648",4);
  builtin_strncpy(local_80,"-2147483",8);
  builtin_strncpy(local_70,"2147483648",0xb);
  builtin_strncpy(local_60 + 8,"649",4);
  builtin_strncpy(local_60,"-2147483",8);
  local_f8 = 0;
  local_100 = 0x3635342e34333231;
  builtin_strncpy(local_108,"1234b56",8);
  builtin_strncpy(local_50 + 8,"45  \n",6);
  builtin_strncpy(local_50,"    +123",8);
  builtin_strncpy(local_c8,"12345",6);
  builtin_strncpy(local_a0,"00012345",9);
  builtin_strncpy(local_d0,"12345",6);
  local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
  local_128.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_128.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_128);
  if (cVar2 == '\0') {
    StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x788,local_40,local_128.fLocalForm,1);
    StrX::~StrX(&local_128);
    errSeen = 1;
  }
  local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
  local_128.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_128.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_128);
  if (cVar2 == '\0') {
    StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x789,local_b0,local_128.fLocalForm,1);
    StrX::~StrX(&local_128);
    errSeen = 1;
  }
  local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
  local_128.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_128.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_128);
  if (cVar2 == '\0') {
    StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x78a,local_c0,local_128.fLocalForm,1);
    StrX::~StrX(&local_128);
    errSeen = 1;
  }
  local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
  local_128.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_e0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_128.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_e0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_128);
  if (cVar2 == '\0') {
    if ((int)local_118 != 6) {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      if (((ulong)local_118 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_118 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x78d,local_e0,local_128.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_0011054a;
    }
  }
  else {
    StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x78d,local_e0,local_128.fLocalForm,0);
LAB_0011054a:
    StrX::~StrX(&local_128);
    errSeen = 1;
  }
  local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
  local_128.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_128.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_128);
  if (cVar2 == '\0') {
    if ((int)local_118 != 6) {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      if (((ulong)local_118 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_118 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x78e,local_f0,local_128.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_0011063e;
    }
  }
  else {
    StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x78e,local_f0,local_128.fLocalForm,0);
LAB_0011063e:
    StrX::~StrX(&local_128);
    errSeen = 1;
  }
  local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
  local_128.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_128.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_128);
  if (cVar2 == '\0') {
    if ((int)local_118 != 6) {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      if (((ulong)local_118 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_118 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x791,&local_100,local_128.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00110732;
    }
  }
  else {
    StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x791,&local_100,local_128.fLocalForm,0);
LAB_00110732:
    StrX::~StrX(&local_128);
    errSeen = 1;
  }
  local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
  local_128.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_128.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_128);
  if (cVar2 == '\0') {
    if ((int)local_118 != 6) {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      if (((ulong)local_118 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_118 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x792,local_108,local_128.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00110826;
    }
  }
  else {
    StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x792,local_108,local_128.fLocalForm,0);
LAB_00110826:
    StrX::~StrX(&local_128);
    errSeen = 1;
  }
  iVar9 = 1;
  do {
    local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
    local_a4 = iVar9;
    local_128.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_128.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_128);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7af,local_40);
      StrX::~StrX(&local_128);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)*(uint *)(pXVar3 + 8);
      if (*(uint *)(pXVar3 + 8) != 0x4d2) {
        printf("ACTVALUE_TEST Unexpected dt_int XSValue, got %d expected %d\n",pvVar7,0x4d2);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    iVar9 = local_a4;
    bVar10 = local_a4 == 1;
    local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
    local_128.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_128.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,bVar10,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_128);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b1,local_b0);
      StrX::~StrX(&local_128);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)*(uint *)(pXVar3 + 8);
      if (*(uint *)(pXVar3 + 8) != 0x7fffffff) {
        printf("ACTVALUE_TEST Unexpected dt_int XSValue, got %d expected %d\n",pvVar7,0x7fffffff);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
    local_128.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_128.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_128);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b2,local_c0);
      StrX::~StrX(&local_128);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)*(uint *)(pXVar3 + 8);
      printf("ACTVALUE_TEST Unexpected dt_int XSValue, got %d expected %d\n",pvVar7,0x80000000);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
    local_128.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_e0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_128.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_e0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_128);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_118 != 6) {
        StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_118 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_118 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x7b3,local_e0,local_128.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_128);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      pvVar7 = (void *)0x7b3;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b3,local_e0);
      StrX::~StrX(&local_128);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
    local_128.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_128.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_128);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_118 != 6) {
        StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_118 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_118 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x7b4,local_f0,local_128.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_128);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      pvVar7 = (void *)0x7b4;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b4,local_f0);
      StrX::~StrX(&local_128);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
    local_128.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_128.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_128);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_118 != 6) {
        StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_118 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_118 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x7b6,&local_100,local_128.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_128);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      pvVar7 = (void *)0x7b6;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b6,&local_100);
      StrX::~StrX(&local_128);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
    local_128.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_128.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_128);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_118 != 6) {
        StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_118 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_118 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x7b7,local_108,local_128.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_128);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      pvVar7 = (void *)0x7b7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b7,local_108);
      StrX::~StrX(&local_128);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 == 0);
  iVar9 = 0;
  do {
    local_10c = st_Init;
    local_128.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_128.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_128.fUnicodeForm,dt_int,&local_10c,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_128);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7d5,local_50);
      StrX::~StrX(&local_128);
      errSeen = 1;
    }
    else {
      local_118 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_c8;
      if (local_118 != pcVar8) {
        pcVar5 = local_118;
        if (local_118 == (char *)0x0) {
LAB_00111026:
          if (*pcVar8 == '\0') goto LAB_00111073;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00111026;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x7d5,local_50,local_128.fLocalForm,local_118,local_c8);
        StrX::~StrX(&local_128);
        errSeen = 1;
      }
LAB_00111073:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_10c = st_Init;
    local_128.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_128.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_128.fUnicodeForm,dt_int,&local_10c,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_128);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7d6,local_a0);
      StrX::~StrX(&local_128);
      errSeen = 1;
    }
    else {
      local_118 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_d0;
      if (local_118 != pcVar8) {
        pcVar5 = local_118;
        if (local_118 == (char *)0x0) {
LAB_00111170:
          if (*pcVar8 == '\0') goto LAB_001111bd;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00111170;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x7d6,local_a0,local_128.fLocalForm,local_118,local_d0);
        StrX::~StrX(&local_128);
        errSeen = 1;
      }
LAB_001111bd:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_10c = st_Init;
    local_128.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_128.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_128.fUnicodeForm,dt_int,&local_10c,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_128);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7d8,local_b0);
      StrX::~StrX(&local_128);
      errSeen = 1;
    }
    else {
      local_118 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_90;
      if (local_118 != pcVar8) {
        pcVar5 = local_118;
        if (local_118 == (char *)0x0) {
LAB_001112b7:
          if (*pcVar8 == '\0') goto LAB_00111304;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_001112b7;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x7d8,local_b0,local_128.fLocalForm,local_118,local_90);
        StrX::~StrX(&local_128);
        errSeen = 1;
      }
LAB_00111304:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_10c = st_Init;
    local_128.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_128.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_128.fUnicodeForm,dt_int,&local_10c,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_128);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7d9,local_c0);
      StrX::~StrX(&local_128);
      errSeen = 1;
    }
    else {
      local_118 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_80;
      if (local_118 != pcVar8) {
        pcVar5 = local_118;
        if (local_118 == (char *)0x0) {
LAB_00111403:
          if (*pcVar8 == '\0') goto LAB_00111450;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00111403;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x7d9,local_c0,local_128.fLocalForm,local_118,local_80);
        StrX::~StrX(&local_128);
        errSeen = 1;
      }
LAB_00111450:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
    local_128.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_128.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,iVar9 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_128);
    if (lVar6 == 0) {
      if ((int)local_118 != 6) {
        StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_118 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_118 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x7db,&local_100,local_128.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_128);
        goto LAB_0011156a;
      }
    }
    else {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7db,&local_100);
      StrX::~StrX(&local_128);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011156a:
      errSeen = 1;
    }
    local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
    local_128.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_128.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,iVar9 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_128);
    if (lVar6 == 0) {
      if ((int)local_118 != 6) {
        StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_118 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_118 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x7dc,local_108,local_128.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_128);
        goto LAB_00111672;
      }
    }
    else {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7dc,local_108);
      StrX::~StrX(&local_128);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_00111672:
      errSeen = 1;
    }
    bVar10 = iVar9 == 0;
    iVar9 = iVar9 + 1;
  } while (bVar10);
  local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
  local_128.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_e0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_128.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_e0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_128);
  if (lVar6 == 0) {
    if ((int)local_118 != 6) {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      if (((ulong)local_118 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_118 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x7e1,local_e0,local_128.fLocalForm,"st_FOCA0002",pcVar8);
      StrX::~StrX(&local_128);
      goto LAB_0011178d;
    }
  }
  else {
    StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x7e1,local_e0);
    StrX::~StrX(&local_128);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011178d:
    errSeen = 1;
  }
  local_118 = (char *)((ulong)local_118 & 0xffffffff00000000);
  local_128.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_128.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_128.fUnicodeForm,dt_int,(Status *)&local_118,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_128);
  if (lVar6 == 0) {
    if ((int)local_118 != 6) {
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      if (((ulong)local_118 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_118 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x7e2,local_f0,local_128.fLocalForm,"st_FOCA0002",pcVar8);
      StrX::~StrX(&local_128);
      goto LAB_00111898;
    }
  }
  else {
    StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x7e2,local_f0);
    StrX::~StrX(&local_128);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_00111898:
    errSeen = 1;
  }
  local_10c = st_Init;
  local_128.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_e0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_128.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_e0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_128.fUnicodeForm,dt_int,&local_10c,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_128);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x7e5,local_e0);
    StrX::~StrX(&local_128);
    errSeen = 1;
  }
  else {
    local_118 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar8 = local_70;
    if (local_118 != pcVar8) {
      pcVar5 = local_118;
      if (local_118 == (char *)0x0) {
LAB_00111975:
        if (*pcVar8 == '\0') goto LAB_001119c4;
      }
      else {
        do {
          cVar2 = *pcVar5;
          if (cVar2 == '\0') goto LAB_00111975;
          pcVar5 = pcVar5 + 1;
          cVar1 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while (cVar2 == cVar1);
      }
      StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x7e5,local_e0,local_128.fLocalForm,local_118,local_70);
      StrX::~StrX(&local_128);
      errSeen = 1;
    }
LAB_001119c4:
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
    xercesc_4_0::XMLString::release(&local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  local_10c = st_Init;
  local_128.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_128.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_128.fUnicodeForm,dt_int,&local_10c,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_128);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x7e6,local_f0,local_128.fLocalForm);
    StrX::~StrX(&local_128);
    errSeen = 1;
    return;
  }
  local_118 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar8 = local_60;
  if (local_118 != pcVar8) {
    pcVar5 = local_118;
    if (local_118 == (char *)0x0) {
LAB_00111ab5:
      if (*pcVar8 == '\0') goto LAB_00111b04;
    }
    else {
      do {
        cVar2 = *pcVar5;
        if (cVar2 == '\0') goto LAB_00111ab5;
        pcVar5 = pcVar5 + 1;
        cVar1 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (cVar2 == cVar1);
    }
    StrX::StrX(&local_128,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
           ,0x7e6,local_f0,local_128.fLocalForm,local_118,local_60);
    StrX::~StrX(&local_128);
    errSeen = 1;
  }
LAB_00111b04:
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
  xercesc_4_0::XMLString::release(&local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void test_dt_int()
{
    const XSValue::DataType dt = XSValue::dt_int;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="    1234     \n";

    const char lex_v_ran_v_1[]="+2147483647";
    const char lex_v_ran_v_2[]="-2147483648";
    const char lex_v_ran_iv_1[]="+2147483648";
    const char lex_v_ran_iv_2[]="-2147483649";

    XSValue::XSValue_Data act_v_ran_v_0;   act_v_ran_v_0.fValue.f_int = (int)1234;
    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_int = (int)+2147483647;
    XSValue::XSValue_Data act_v_ran_v_2;   act_v_ran_v_2.fValue.f_int = (int)-2147483648;

    const char lex_v_ran_v_1_canrep[]="2147483647";
    const char lex_v_ran_v_2_canrep[]="-2147483648";
    const char lex_v_ran_iv_1_canrep[]="2147483648";
    const char lex_v_ran_iv_2_canrep[]="-2147483649";

    const char lex_iv_1[]="1234.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.17.2 Canonical representation
 *
 * The canonical representation for int is defined by prohibiting certain options from the
 * Lexical representation (3.3.17.1). Specifically,
 * 1. the the optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="    +12345  \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,        DONT_CARE);
        CANREP_TEST(data_rawstr_2, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,        XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep, DONT_CARE);

        CANREP_TEST(lex_iv_1,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}